

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdcolor.c
# Opt level: O1

void null_convert(j_decompress_ptr cinfo,JSAMPIMAGE input_buf,JDIMENSION input_row,
                 JSAMPARRAY output_buf,int num_rows)

{
  int iVar1;
  JDIMENSION JVar2;
  JSAMPROW pJVar3;
  bool bVar4;
  long lVar5;
  JSAMPROW pJVar6;
  long lVar7;
  
  if (0 < num_rows) {
    iVar1 = cinfo->num_components;
    JVar2 = cinfo->output_width;
    do {
      if (0 < iVar1) {
        lVar5 = 0;
        do {
          if (JVar2 != 0) {
            pJVar6 = *output_buf + lVar5;
            pJVar3 = input_buf[lVar5][input_row];
            lVar7 = 0;
            do {
              *pJVar6 = pJVar3[lVar7];
              pJVar6 = pJVar6 + iVar1;
              lVar7 = lVar7 + 1;
            } while (JVar2 != (JDIMENSION)lVar7);
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 != iVar1);
      }
      input_row = input_row + 1;
      output_buf = output_buf + 1;
      bVar4 = 1 < num_rows;
      num_rows = num_rows + -1;
    } while (bVar4);
  }
  return;
}

Assistant:

METHODDEF(void)
null_convert (j_decompress_ptr cinfo,
	      JSAMPIMAGE input_buf, JDIMENSION input_row,
	      JSAMPARRAY output_buf, int num_rows)
{
  register JSAMPROW inptr, outptr;
  register JDIMENSION count;
  register int num_components = cinfo->num_components;
  JDIMENSION num_cols = cinfo->output_width;
  int ci;

  while (--num_rows >= 0) {
    for (ci = 0; ci < num_components; ci++) {
      inptr = input_buf[ci][input_row];
      outptr = output_buf[0] + ci;
      for (count = num_cols; count > 0; count--) {
	*outptr = *inptr++;	/* needn't bother with GETJSAMPLE() here */
	outptr += num_components;
      }
    }
    input_row++;
    output_buf++;
  }
}